

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O1

void JsonErrors::INVALID_BOOL(Value *value,cmJSONState *state)

{
  cmJSONState *local_70;
  Value *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"a bool","");
  EXPECTED_TYPE((ErrorGenerator *)&local_60,&local_40);
  local_70 = state;
  local_68 = value;
  if (local_50 != (code *)0x0) {
    (*local_48)(&local_60,&local_68,&local_70);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void INVALID_BOOL(const Json::Value* value, cmJSONState* state)
{
  JsonErrors::EXPECTED_TYPE("a bool")(value, state);
}